

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::ubo::anon_unknown_0::createAttachmentView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,Context *context,
          VkImage image,VkFormat format)

{
  DeviceInterface *vk;
  VkDevice device;
  undefined1 local_78 [8];
  VkImageViewCreateInfo params;
  VkFormat format_local;
  Context *context_local;
  VkImage image_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  params.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  params._4_4_ = 0;
  params.pNext._0_4_ = 0;
  params.image.m_internal._0_4_ = 1;
  params._16_8_ = image.m_internal;
  params.image.m_internal._4_4_ = format;
  params._76_4_ = format;
  params._32_16_ = ::vk::makeComponentMappingRGBA();
  params.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  params.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  params.subresourceRange.aspectMask = 1;
  params.subresourceRange.baseMipLevel = 0;
  params.subresourceRange.levelCount = 1;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  ::vk::createImageView
            (__return_storage_ptr__,vk,device,(VkImageViewCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<vk::VkImageView> createAttachmentView (Context& context, vk::VkImage image, vk::VkFormat format)
{
	const vk::VkImageViewCreateInfo params =
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// sType
		DE_NULL,											// pNext
		0u,													// flags
		image,												// image
		vk::VK_IMAGE_VIEW_TYPE_2D,							// viewType
		format,												// format
		vk::makeComponentMappingRGBA(),						// components
		{ vk::VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u,1u },	// subresourceRange
	};

	return vk::createImageView(context.getDeviceInterface(), context.getDevice(), &params);
}